

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void allocate_imp_map<ImputedData<unsigned_long,long_double>,InputData<double,unsigned_long>>
               (robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                *impute_map,InputData<double,_unsigned_long> *input_data)

{
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar1;
  ulong local_118;
  ImputedData<unsigned_long,_long_double> local_110;
  
  for (local_118 = 0; local_118 < input_data->nrows; local_118 = local_118 + 1) {
    if ((input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[local_118] != '\0') {
      ImputedData<unsigned_long,long_double>::ImputedData<InputData<double,unsigned_long>>
                ((ImputedData<unsigned_long,long_double> *)&local_110,input_data,local_118);
      pVar1 = tsl::detail_robin_hash::
              robin_hash<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>,tsl::robin_map<unsigned_long,ImputedData<unsigned_long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<unsigned_long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              ::try_emplace<unsigned_long_const&>
                        ((robin_hash<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>,tsl::robin_map<unsigned_long,ImputedData<unsigned_long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<unsigned_long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<unsigned_long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                          *)impute_map,&local_118);
      ImputedData<unsigned_long,_long_double>::operator=
                ((ImputedData<unsigned_long,_long_double> *)
                 ((pVar1.first.m_bucket.m_bucket)->m_value + 8),&local_110);
      ImputedData<unsigned_long,_long_double>::~ImputedData(&local_110);
    }
  }
  return;
}

Assistant:

void allocate_imp_map(hashed_map<size_t, ImputedData> &impute_map, InputData &input_data)
{
    for (size_t row = 0; row < input_data.nrows; row++)
        if (input_data.has_missing[row])
            impute_map[row] = ImputedData(input_data, row);
}